

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

bool duckdb::PushdownInternal
               (ClientContext *context,MultiFileOptions *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,vector<duckdb::LogicalType,_true> *types,
               vector<unsigned_long,_true> *column_ids,TableFilterSet *filters,
               vector<duckdb::OpenFileInfo,_true> *expanded_files)

{
  column_t column_id;
  ulong uVar1;
  undefined1 auVar2 [16];
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> uVar3;
  bool bVar4;
  const_reference pvVar5;
  const_reference other;
  BoundColumnRefExpression *this;
  pointer pTVar6;
  type pBVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_header *p_Var9;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  filter_expressions;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> filter_expr;
  ExtraOperatorInfo extra_info;
  MultiFilePushdownInfo info;
  _Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false> local_110;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_108;
  ClientContext *local_e8;
  MultiFileOptions *local_e0;
  vector<duckdb::LogicalType,_true> *local_d8;
  vector<unsigned_long,_true> *local_d0;
  long *local_c8 [3];
  ExtraOperatorInfo local_b0;
  MultiFilePushdownInfo local_78;
  
  local_b0.file_filters._M_dataplus._M_p = (pointer)&local_b0.file_filters.field_2;
  local_b0.file_filters._M_string_length = 0;
  local_b0.file_filters.field_2._M_local_buf[0] = '\0';
  local_b0.total_files.index._0_4_ = 0xffffffff;
  local_b0.total_files.index._4_4_ = 0xffffffff;
  local_b0.filtered_files.index._0_4_ = 0xffffffff;
  local_b0.filtered_files.index._4_4_ = 0xffffffff;
  local_b0.sample_options.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
       (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
        )0x0;
  local_e8 = context;
  local_e0 = options;
  local_d8 = types;
  local_d0 = column_ids;
  MultiFilePushdownInfo::MultiFilePushdownInfo(&local_78,0,names,column_ids,&local_b0);
  local_108.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var8 = (filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(filters->filters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var9) {
    do {
      pvVar5 = vector<unsigned_long,_true>::operator[](local_d0,*(size_type *)(p_Var8 + 1));
      column_id = *pvVar5;
      bVar4 = IsVirtualColumn(column_id);
      if (!bVar4) {
        other = vector<duckdb::LogicalType,_true>::operator[](local_d8,column_id);
        uVar1 = *(ulong *)(p_Var8 + 1);
        this = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType((LogicalType *)local_c8,other);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar1;
        BoundColumnRefExpression::BoundColumnRefExpression
                  (this,(LogicalType *)local_c8,(ColumnBinding)(auVar2 << 0x40),0);
        local_110._M_head_impl = this;
        LogicalType::~LogicalType((LogicalType *)local_c8);
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                             *)&p_Var8[1]._M_parent);
        pBVar7 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                 ::operator*((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                              *)&local_110);
        (*pTVar6->_vptr_TableFilter[6])((LogicalType *)local_c8,pTVar6,pBVar7);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_108,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_c8);
        if (local_c8[0] != (long *)0x0) {
          (**(code **)(*local_c8[0] + 8))();
        }
        if (local_110._M_head_impl != (BoundColumnRefExpression *)0x0) {
          (*((local_110._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression
            [1])();
        }
      }
      p_Var8 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var9);
  }
  bVar4 = PushdownInternal(local_e8,local_e0,&local_78,&local_108,expanded_files);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_108);
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
            (&local_78.column_indexes.
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
  if (local_78.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar3.super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
       local_b0.sample_options;
  if (local_b0.sample_options.
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
       )0x0) {
    Value::~Value((Value *)local_b0.sample_options.
                           super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                           .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
    operator_delete((void *)uVar3.
                            super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                            .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
  }
  local_b0.sample_options.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
       (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
        )0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.file_filters._M_dataplus._M_p != &local_b0.file_filters.field_2) {
    operator_delete(local_b0.file_filters._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool PushdownInternal(ClientContext &context, const MultiFileOptions &options, const vector<string> &names,
                      const vector<LogicalType> &types, const vector<column_t> &column_ids,
                      const TableFilterSet &filters, vector<OpenFileInfo> &expanded_files) {
	idx_t table_index = 0;
	ExtraOperatorInfo extra_info;

	// construct the pushdown info
	MultiFilePushdownInfo info(table_index, names, column_ids, extra_info);

	// construct the set of expressions from the table filters
	vector<unique_ptr<Expression>> filter_expressions;
	for (auto &entry : filters.filters) {
		idx_t local_index = entry.first;
		idx_t column_idx = column_ids[local_index];
		if (IsVirtualColumn(column_idx)) {
			continue;
		}
		auto column_ref =
		    make_uniq<BoundColumnRefExpression>(types[column_idx], ColumnBinding(table_index, entry.first));
		auto filter_expr = entry.second->ToExpression(*column_ref);
		filter_expressions.push_back(std::move(filter_expr));
	}

	// call the original PushdownInternal method
	return PushdownInternal(context, options, info, filter_expressions, expanded_files);
}